

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::InputFloat(char *label,float *v,float step,float step_fast,int decimal_precision,
                      ImGuiInputTextFlags flags)

{
  bool bVar1;
  float *step_00;
  float *step_fast_00;
  char format [16];
  float local_30;
  float local_2c;
  char local_28 [16];
  
  local_28[0] = '%';
  local_28[1] = 'f';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  if (-1 < decimal_precision) {
    ImFormatString(local_28,0x10,"%%.%df",decimal_precision);
  }
  step_00 = &local_2c;
  if (step <= 0.0) {
    step_00 = (float *)0x0;
  }
  step_fast_00 = (float *)0x0;
  if (0.0 < step_fast) {
    step_fast_00 = &local_30;
  }
  local_30 = step_fast;
  local_2c = step;
  bVar1 = InputScalar(label,8,v,step_00,step_fast_00,local_28,flags | 0x20000);
  return bVar1;
}

Assistant:

bool ImGui::InputFloat(const char* label, float* v, float step, float step_fast, int decimal_precision, ImGuiInputTextFlags flags)
{
    char format[16] = "%f";
    if (decimal_precision >= 0)
        ImFormatString(format, IM_ARRAYSIZE(format), "%%.%df", decimal_precision);
    return InputFloat(label, v, step, step_fast, format, flags);
}